

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          *per_pixel_fn)

{
  long lVar1;
  Image *this_00;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint64_t da;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  long local_d0;
  uint64_t local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  Image *local_78;
  Image *local_70;
  long local_68;
  long local_60;
  ssize_t local_58;
  long local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar7 = source->width;
  if (w < 0) {
    w = lVar7;
  }
  lVar1 = source->height;
  if (h < 0) {
    h = lVar1;
  }
  uVar4 = sx >> 0x3f & sx;
  lVar2 = x - uVar4;
  lVar3 = 0;
  if (sx < 1) {
    sx = lVar3;
  }
  uVar5 = sy >> 0x3f & sy;
  local_98 = y - uVar5;
  if (sy < 1) {
    sy = lVar3;
  }
  local_68 = 0;
  if (0 < lVar2) {
    local_68 = lVar2;
  }
  if (-1 < lVar2) {
    lVar2 = lVar3;
  }
  uVar4 = uVar4 + w + lVar2;
  lVar2 = sx - lVar2;
  local_a0 = 0;
  if (0 < local_98) {
    local_a0 = local_98;
  }
  if (-1 < local_98) {
    local_98 = lVar3;
  }
  uVar6 = uVar5 + h + local_98;
  local_98 = sy - local_98;
  uVar5 = lVar7 - lVar2;
  if ((long)(uVar4 + lVar2) <= lVar7) {
    uVar5 = uVar4;
  }
  uVar4 = lVar1 - local_98;
  if ((long)(uVar6 + local_98) <= lVar1) {
    uVar4 = uVar6;
  }
  uVar6 = this->width - local_68;
  if ((long)(uVar5 + local_68) <= this->width) {
    uVar6 = uVar5;
  }
  local_90 = this->height - local_a0;
  if ((long)(uVar4 + local_a0) <= this->height) {
    local_90 = uVar4;
  }
  if (0 < (long)local_90 && -1 < (long)(local_90 | uVar6)) {
    local_d0 = 0;
    local_88 = lVar2;
    local_80 = uVar6;
    local_78 = source;
    local_70 = this;
    do {
      if (0 < (long)uVar6) {
        local_58 = local_98 + local_d0;
        local_60 = local_a0 + local_d0;
        lVar7 = 0;
        do {
          read_pixel(local_78,lVar2 + lVar7,local_58,&local_a8,&local_b0,&local_b8,&local_c0);
          lVar1 = local_60;
          this_00 = local_70;
          local_50 = local_68 + lVar7;
          read_pixel(local_70,local_50,local_60,&local_38,&local_40,&local_48,&local_c8);
          ::std::
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          ::operator()(per_pixel_fn,&local_38,&local_40,&local_48,&local_c8,local_a8,local_b0,
                       local_b8,local_c0);
          lVar2 = local_88;
          write_pixel(this_00,local_50,lVar1,local_38,local_40,local_48,local_c8);
          lVar7 = lVar7 + 1;
          uVar6 = local_80;
        } while (lVar7 < (long)local_80);
      }
      local_d0 = local_d0 + 1;
    } while (local_d0 < (long)local_90);
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint64_t&, uint64_t&, uint64_t&, uint64_t&, uint64_t, uint64_t, uint64_t, uint64_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa, dr, dg, db, da;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);

      per_pixel_fn(dr, dg, db, da, sr, sg, sb, sa);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}